

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

float32 diag_norm(vector_t var,uint32 len)

{
  double dVar1;
  uint local_20;
  uint32 i;
  float32 p;
  float32 log_det;
  uint32 len_local;
  vector_t var_local;
  
  i = 0;
  local_20 = 0;
  while( true ) {
    if (len <= local_20) {
      dVar1 = log(6.283185307179586);
      return (float32)(((float)i + (float)((double)len * dVar1)) * -0.5);
    }
    if (var[local_20] <= 0.0) break;
    dVar1 = log((double)var[local_20]);
    i = (uint32)(float)((double)(float)i + dVar1);
    local_20 = local_20 + 1;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
          ,0x152,"Sanity check var[i] > 0 failed: %e\n",(double)var[local_20]);
  exit(1);
}

Assistant:

float32
diag_norm(vector_t var,
	  uint32 len)
{
    float32 log_det;
    float32 p;
    uint32 i;

    log_det = 0;

    for (i = 0; i < len; i++) {
	if (var[i] <= 0) {
	    E_FATAL("Sanity check var[i] > 0 failed: %e\n", var[i]);
	}
	log_det += log(var[i]);
    }

    p = len * log(2.0 * M_PI);

    return - 0.5 * (log_det + p);
}